

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPointForceJacobian
          (ContactConstraint *this,Model *model,VectorNd *Q,ConstraintCache *cache,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *fExtSysUpd,
          bool updateKinematics)

{
  double *pdVar1;
  long lVar2;
  pointer pSVar3;
  uint uVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  SpatialVector local_68;
  
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_68,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x60) =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  *(double *)(cache + 0x50) =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 0x58) =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)(cache + 0x50);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(cache + 0x4b8),
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&local_68);
  *(undefined8 *)(cache + 0x360) = 0;
  *(undefined8 *)(cache + 0x350) = 0;
  *(undefined8 *)(cache + 0x358) = 0;
  lVar6 = 0x10;
  for (uVar5 = 0; uVar5 < (this->super_Constraint).sizeOfConstraint; uVar5 = uVar5 + 1) {
    lVar2 = *(long *)&(this->super_Constraint).field_0xd8;
    *(ulong *)(cache + 0x368) = *(ulong *)(lVar2 + -0x10 + lVar6) ^ 0x8000000000000000;
    *(ulong *)(cache + 0x370) = *(ulong *)(lVar2 + -8 + lVar6) ^ 0x8000000000000000;
    *(ulong *)(cache + 0x378) = *(ulong *)(lVar2 + lVar6) ^ 0x8000000000000000;
    Math::SpatialTransform::applyAdjoint
              (&local_68,(SpatialTransform *)(cache + 0x470),(SpatialVector *)(cache + 0x350));
    uVar4 = (this->super_Constraint).rowInSystem + (int)uVar5;
    pSVar3 = (fExtSysUpd->super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>)
             .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (double *)
             ((long)&pSVar3[uVar4].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    *pdVar1 = local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
    ;
    pdVar1[1] = local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [5];
    pdVar1 = (double *)
             ((long)&pSVar3[uVar4].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    *pdVar1 = local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
    ;
    pdVar1[1] = local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [3];
    *(double *)
     &pSVar3[uVar4].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar3[uVar4].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
         local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    lVar6 = lVar6 + 0x18;
  }
  return;
}

Assistant:

void ContactConstraint::
      calcPointForceJacobian(
        Model &model,
        const Math::VectorNd &Q,
        ConstraintCache &cache,
        std::vector<Math::SpatialVector> &fExtSysUpd,
        bool updateKinematics)
{
  cache.vec3A = CalcBodyToBaseCoordinates(
                  model,Q,bodyIds[0],bodyFrames[0].r,updateKinematics);
  cache.stA.E.Identity();
  cache.stA.r = -cache.vec3A;
  cache.svecA[0]=0.;
  cache.svecA[1]=0.;
  cache.svecA[2]=0.;
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    cache.svecA[3] = -T[i][0];
    cache.svecA[4] = -T[i][1];
    cache.svecA[5] = -T[i][2];
    fExtSysUpd[rowInSystem+i] = cache.stA.applyAdjoint( cache.svecA );
  }
}